

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_map.hpp
# Opt level: O2

pair<__gnu_cxx::__normal_iterator<std::pair<Rml::EventId,_Rml::EventListener_*>_*,_std::vector<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>_>,_bool>
 __thiscall
itlib::
flat_map<Rml::EventId,Rml::EventListener*,itlib::fmimpl::less,std::vector<std::pair<Rml::EventId,Rml::EventListener*>,std::allocator<std::pair<Rml::EventId,Rml::EventListener*>>>>
::insert<std::pair<Rml::EventId,Rml::EventListener*>>
          (flat_map<Rml::EventId,Rml::EventListener*,itlib::fmimpl::less,std::vector<std::pair<Rml::EventId,Rml::EventListener*>,std::allocator<std::pair<Rml::EventId,Rml::EventListener*>>>>
           *this,pair<Rml::EventId,_Rml::EventListener_*> *val)

{
  __normal_iterator<std::pair<Rml::EventId,_Rml::EventListener_*>_*,_std::vector<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>_>
  __position;
  undefined8 extraout_RDX;
  undefined8 uVar1;
  pair<__gnu_cxx::__normal_iterator<std::pair<Rml::EventId,_Rml::EventListener_*>_*,_std::vector<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>_>,_bool>
  pVar2;
  
  __position._M_current =
       (pair<Rml::EventId,_Rml::EventListener_*> *)
       flat_map<Rml::EventId,_Rml::EventListener_*,_itlib::fmimpl::less,_std::vector<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>_>
       ::lower_bound<Rml::EventId>
                 ((flat_map<Rml::EventId,_Rml::EventListener_*,_itlib::fmimpl::less,_std::vector<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>_>
                   *)this,&val->first);
  if ((__position._M_current == *(pair<Rml::EventId,_Rml::EventListener_*> **)(this + 8)) ||
     (val->first < (__position._M_current)->first)) {
    __position._M_current =
         (pair<Rml::EventId,_Rml::EventListener_*> *)
         std::
         vector<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>
         ::_M_insert_rval((vector<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>
                           *)this,(const_iterator)__position._M_current,val);
    uVar1 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  }
  else {
    uVar1 = 0;
  }
  pVar2._8_8_ = uVar1;
  pVar2.first._M_current = __position._M_current;
  return pVar2;
}

Assistant:

std::pair<iterator, bool> insert(P&& val)
    {
        auto i = lower_bound(val.first);
        if (i != end() && !cmp()(val.first, *i))
        {
            return { i, false };
        }

        return{ m_container.emplace(i, std::forward<P>(val)), true };
    }